

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O3

void SerializeTransaction<ParamsStream<VectorWriter&,TransactionSerParams>,CTransaction>
               (CTransaction *tx,ParamsStream<VectorWriter_&,_TransactionSerParams> *s,
               TransactionSerParams *params)

{
  bool bVar1;
  size_t in_RCX;
  pointer pCVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  vector<CTxIn,_std::allocator<CTxIn>_> vinDummy;
  vector<CTxIn,_std::allocator<CTxIn>_> local_58;
  VectorFormatter<DefaultFormatter> local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = params->allow_witness;
  local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,tx->version);
  VectorWriter::write(s->m_substream,(int)&local_58,(void *)0x4,in_RCX);
  if ((bVar1 == true) && (tx->m_has_witness == true)) {
    local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<VectorWriter&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
              (&local_39,s,&local_58);
    local_39 = (VectorFormatter<DefaultFormatter>)0x1;
    VectorWriter::write(s->m_substream,(int)&local_39,(void *)0x1,in_RCX);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_58);
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<VectorWriter&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
              ((VectorFormatter<DefaultFormatter> *)&local_58,s,&tx->vin);
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<VectorWriter&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
              ((VectorFormatter<DefaultFormatter> *)&local_58,s,&tx->vout);
    pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_finish != pCVar2) {
      lVar3 = 0x50;
      uVar4 = 0;
      do {
        VectorFormatter<DefaultFormatter>::
        Ser<ParamsStream<VectorWriter&,TransactionSerParams>,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                  ((VectorFormatter<DefaultFormatter> *)&local_58,s,
                   (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)((pCVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                      lVar3));
        uVar4 = uVar4 + 1;
        pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar3 = lVar3 + 0x68;
      } while (uVar4 < (ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pCVar2 >> 3)
                              * 0x4ec4ec4ec4ec4ec5));
    }
  }
  else {
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<VectorWriter&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
              ((VectorFormatter<DefaultFormatter> *)&local_58,s,&tx->vin);
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<VectorWriter&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
              ((VectorFormatter<DefaultFormatter> *)&local_58,s,&tx->vout);
  }
  local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,tx->nLockTime);
  VectorWriter::write(s->m_substream,(int)&local_58,(void *)0x4,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SerializeTransaction(const TxType& tx, Stream& s, const TransactionSerParams& params)
{
    const bool fAllowWitness = params.allow_witness;

    s << tx.version;
    unsigned char flags = 0;
    // Consistency check
    if (fAllowWitness) {
        /* Check whether witnesses need to be serialized. */
        if (tx.HasWitness()) {
            flags |= 1;
        }
    }
    if (flags) {
        /* Use extended format in case witnesses are to be serialized. */
        std::vector<CTxIn> vinDummy;
        s << vinDummy;
        s << flags;
    }
    s << tx.vin;
    s << tx.vout;
    if (flags & 1) {
        for (size_t i = 0; i < tx.vin.size(); i++) {
            s << tx.vin[i].scriptWitness.stack;
        }
    }
    s << tx.nLockTime;
}